

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O1

void __thiscall LRGrammaticalAnalyzer::LRGrammaticalAnalyzer(LRGrammaticalAnalyzer *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar5;
  pointer pbVar6;
  int iVar7;
  istream *piVar8;
  long *plVar9;
  mapped_type_conflict1 *pmVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  long lVar14;
  pointer ppVar15;
  pointer pbVar16;
  int stid;
  int sz;
  int toid;
  string item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rightpart;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  x;
  string leftpart;
  string fr;
  string to;
  ifstream readgoto;
  ifstream readproduction;
  ifstream readaction;
  int local_7f8;
  int local_7f4;
  pointer local_7f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_7e8;
  int local_7dc;
  value_type local_7d8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_7b8;
  vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  *local_7b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_788;
  string *local_780;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  key_type local_720;
  undefined1 *local_700;
  undefined8 local_6f8;
  undefined1 local_6f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [16];
  istream local_238 [520];
  
  p_Var1 = &(this->VT)._M_t._M_impl.super__Rb_tree_header;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VT)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->VN)._M_t._M_impl.super__Rb_tree_header;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VN)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->FIRST)._M_t._M_impl.super__Rb_tree_header;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->FOLLOW)._M_t._M_impl.super__Rb_tree_header;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FOLLOW)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->P)._M_t._M_impl.super__Rb_tree_header;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->P)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_780 = &this->START;
  local_788 = &(this->START).field_2;
  (this->START)._M_dataplus._M_p = (pointer)local_788;
  (this->START)._M_string_length = 0;
  (this->START).field_2._M_local_buf[0] = '\0';
  p_Var13 = &this->ACTION[0]._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar14 = 0xae0;
  do {
    ((_Rb_tree_node_base *)&p_Var13->_M_color)->_M_color = _S_red;
    p_Var13->_M_parent = (_Base_ptr)0x0;
    p_Var13->_M_left = p_Var13;
    p_Var13->_M_right = p_Var13;
    *(undefined8 *)(p_Var13 + 1) = 0;
    p_Var13 = (_Base_ptr)&p_Var13[1]._M_left;
    lVar14 = lVar14 + -0x30;
  } while (lVar14 != 0);
  local_7f0 = (pointer)this->ACTION;
  lVar14 = 0xbf8;
  do {
    puVar2 = &(this->VT)._M_t._M_impl.field_0x0 + lVar14;
    *(undefined4 *)(&(this->VT)._M_t._M_impl.field_0x0 + lVar14) = 0;
    *(undefined8 *)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar14) = 0;
    *(undefined1 **)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar14) = puVar2;
    *(undefined1 **)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + lVar14) = puVar2;
    *(undefined8 *)
     ((long)&(this->VT)._M_t._M_impl.super__Rb_tree_header._M_header._M_right + lVar14) = 0;
    lVar14 = lVar14 + 0x30;
  } while (lVar14 != 0x16d8);
  local_7b8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->VN;
  local_7b0 = (vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
               *)&this->VectorP;
  (this->VectorP).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->VectorP).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->VectorP).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)local_780,0,(char *)0x0,0x1271bb);
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"{","");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"}","");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"if","");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"(","");
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_660,")","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"then","");
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"else","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"while","");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,">","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"<","");
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"<=","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,">=","");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"==","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"=","");
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,";","");
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"ID","");
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"NUM","");
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"+","");
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"-","");
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"*","");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"/","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_assign_unique<std::__cxx11::string_const*>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,&local_6e0,local_440);
  local_7e8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this->GOTO;
  lVar14 = 0;
  do {
    if (local_450 + lVar14 != *(undefined1 **)((long)local_460 + lVar14)) {
      operator_delete(*(undefined1 **)((long)local_460 + lVar14));
    }
    lVar14 = lVar14 + -0x20;
  } while (lVar14 != -0x2a0);
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"program","");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"compoundstmt","");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"stmt","");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"ifstmt","");
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"whilestmt","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"assgstmt","");
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"stmts","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"boolexpr","");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"arithexpr","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"multexpr","");
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"arithexprprime","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"simpleexpr","");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"multexprprime","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"boolop","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_assign_unique<std::__cxx11::string_const*>(local_7b8,&local_6e0,&local_520);
  lVar14 = 0;
  do {
    if (local_530 + lVar14 != *(undefined1 **)((long)local_540 + lVar14)) {
      operator_delete(*(undefined1 **)((long)local_540 + lVar14));
    }
    lVar14 = lVar14 + -0x20;
  } while (lVar14 != -0x1c0);
  std::ifstream::ifstream(&local_6e0,"GOTO.txt",_S_in);
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  local_720._M_string_length = 0;
  local_720.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar8 = (istream *)std::istream::operator>>((istream *)&local_6e0,&local_7f8);
    piVar8 = std::operator>>(piVar8,(string *)&local_720);
    plVar9 = (long *)std::istream::operator>>(piVar8,&local_7dc);
    iVar7 = local_7dc;
    if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) break;
    if (local_7dc != 0) {
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)((_Rep_type *)&local_7e8->first + local_7f8),&local_720);
      *pmVar10 = iVar7;
    }
  }
  std::ifstream::close();
  std::ifstream::ifstream(local_238,"ACTION.txt",_S_in);
  local_700 = local_6f0;
  local_6f8 = 0;
  local_6f0[0] = 0;
  while( true ) {
    piVar8 = (istream *)std::istream::operator>>(local_238,&local_7f8);
    piVar8 = std::operator>>(piVar8,(string *)&local_720);
    piVar8 = std::operator>>(piVar8,(string *)&local_700);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
    iVar7 = std::__cxx11::string::compare((char *)&local_700);
    if (iVar7 != 0) {
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)local_7f0 + (long)local_7f8 * 0x30),&local_720);
      std::__cxx11::string::_M_assign((string *)pmVar11);
    }
  }
  std::ifstream::close();
  std::ifstream::ifstream(local_440,"PRODUCTION.txt",_S_in);
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  local_740._M_string_length = 0;
  local_740.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_7d8.field_2;
  while( true ) {
    piVar8 = std::operator>>((istream *)local_440,(string *)&local_740);
    plVar9 = (long *)std::istream::operator>>(piVar8,&local_7f4);
    if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) break;
    local_7a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_7a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_7a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7d8._M_string_length = 0;
    local_7d8.field_2._M_local_buf[0] = '\0';
    local_7d8._M_dataplus._M_p = (pointer)paVar3;
    if (0 < local_7f4) {
      iVar7 = 0;
      do {
        std::operator>>((istream *)local_440,(string *)&local_7d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_7a8,&local_7d8);
        iVar7 = iVar7 + 1;
      } while (iVar7 < local_7f4);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
              (&local_778,&local_740,&local_7a8);
    std::
    vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
    ::
    emplace_back<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_7b0,&local_778);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_778.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778.first._M_dataplus._M_p != &local_778.first.field_2) {
      operator_delete(local_778.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_7d8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7a8);
  }
  std::ifstream::close();
  ppVar15 = (this->VectorP).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_7f0 = (this->VectorP).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != local_7f0) {
    do {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(&local_778,ppVar15);
      local_7e8 = ppVar15;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_778.first._M_dataplus._M_p,
                           local_778.first._M_string_length);
      local_7d8._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_7d8,1);
      pbVar6 = local_778.second.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar16 = local_778.second.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar6;
          pbVar16 = pbVar16 + 1) {
        pcVar4 = (pbVar16->_M_dataplus)._M_p;
        local_7d8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d8,pcVar4,pcVar4 + pbVar16->_M_string_length);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_7d8._M_dataplus._M_p,
                             local_7d8._M_string_length);
        local_7a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_7a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_7a8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != paVar3) {
          operator_delete(local_7d8._M_dataplus._M_p);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_778.second);
      ppVar5 = local_7e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_778.first._M_dataplus._M_p != &local_778.first.field_2) {
        operator_delete(local_778.first._M_dataplus._M_p);
      }
      ppVar15 = ppVar5 + 1;
    } while (ppVar15 != local_7f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_440);
  if (local_700 != local_6f0) {
    operator_delete(local_700);
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(&local_6e0);
  return;
}

Assistant:

LRGrammaticalAnalyzer::LRGrammaticalAnalyzer() {
//    GOTO[0]["S"] = 1;
//    GOTO[0]["B"] = 2;
//    GOTO[2]["B"] = 5;
//    GOTO[3]["B"] = 6;
//
//    //r0->r3
//    //r1->r2
//    //r2->r0
//    //r3->r1
//
//    ACTION[0]["a"] = "s3";
//    ACTION[0]["b"] = "s4";
//
//    ACTION[1]["$"] = "acc";
//
//    ACTION[2]["a"] = "s3";
//    ACTION[2]["b"] = "s4";
//
//    ACTION[3]["a"] = "s3";
//    ACTION[3]["b"] = "s4";
//
//    ACTION[4]["a"] = "r1";
//    ACTION[4]["b"] = "r1";
//    ACTION[4]["$"] = "r1";
//
//    ACTION[5]["a"] = "r2";
//    ACTION[5]["b"] = "r2";
//    ACTION[5]["$"] = "r2";
//
//    ACTION[6]["a"] = "r0";
//    ACTION[6]["b"] = "r0";
//    ACTION[6]["c"] = "r0";
//
//    START = "S'";
//    VT = {"a", "b", "$"};
//    VN = {"S", "B", "S'"};
//    P.insert({"S'", {"S"}});
//    P.insert({"S", {"B", "B"}});
//    P.insert({"B", {"a", "B"}});
//    P.insert({"B", {"b"}});
//
//    for (auto x:P)
//        VectorP.push_back(x);

//    for(auto x:VectorP){
//        std::cout<<x.first<<' ';
//        for(auto y:x.second){
//            std::cout<<y<<' ';
//        }
//        std::cout<<std::endl;
//    }

    START = "program'";
    VT = {"{", "}", "if", "(", ")", "then", "else", "while", ">", "<", "<=", ">=", "==", "=", ";", "ID", "NUM", "+",
          "-", "*", "/"};
    VN = {"program", "compoundstmt", "stmt", "ifstmt", "whilestmt", "assgstmt",
          "stmts", "boolexpr", "arithexpr", "multexpr", "arithexprprime", "simpleexpr",
          "multexprprime", "boolop"};

    std::ifstream readgoto("GOTO.txt");
    int stid, toid;
    std::string fr;
    while (readgoto >> stid >> fr >> toid) {
        if (toid == 0)
            continue;
        GOTO[stid][fr] = toid;
    }
    readgoto.close();

    std::ifstream readaction("ACTION.txt");
    std::string to;
    while (readaction >> stid >> fr >> to) {
        if (to == "0")
            continue;
        ACTION[stid][fr] = to;
    }
    readaction.close();

    std::ifstream readproduction("PRODUCTION.txt");
    std::string leftpart;
    int sz;
    while (readproduction >> leftpart >> sz) {
        std::vector<std::string> rightpart;
        std::string item;
        for (int i = 0; i < sz; i++) {
            readproduction >> item;
            rightpart.push_back(item);
        }
        VectorP.push_back(make_pair(leftpart, rightpart));
    }
    readproduction.close();
    for (auto x:VectorP) {
        std::cout << x.first << ' ';
        for (auto y:x.second) {
            std::cout << y << ' ';
        }
        std::cout << std::endl;
    }
}